

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O1

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
mxx::impl::
split<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,impl *this,
          long begin,long *end,long param_5)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  unsigned_long uVar6;
  pointer puVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  _Var16;
  ulong uVar17;
  pair<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  pVar18;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *send_counts;
  int rank;
  allocator_type local_61;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_60;
  long local_58;
  value_type_conflict2 local_50;
  long *local_48;
  ulong local_40;
  long local_38;
  
  local_60 = __return_storage_ptr__;
  local_58 = begin;
  local_48 = end;
  if (end[1] - *end >> 3 != (long)*(int *)(param_5 + 0x10) + -1) {
    MPI_Comm_rank(&ompi_mpi_comm_world,&local_50);
    printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",local_50 & 0xffffffff,
           "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/samplesort.hpp"
           ,0xc3,"split","splitters.size() == (size_t)comm.size() - 1");
    fflush(_stdout);
    MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
  }
  local_50 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (local_60,(long)*(int *)(param_5 + 0x10),&local_50,&local_61);
  local_40 = local_58 - (long)this >> 3;
  uVar4 = local_40 / *(uint *)(param_5 + 0x10);
  uVar8 = local_40 % (ulong)*(uint *)(param_5 + 0x10);
  lVar5 = *local_48;
  local_38 = param_5;
  if (local_48[1] - lVar5 != 0) {
    uVar9 = local_48[1] - lVar5 >> 3;
    uVar11 = 0;
    _Var16._M_current = (pair<int,_int> *)this;
    do {
      uVar17 = uVar11 + 1;
      uVar14 = 1;
      if (uVar17 < uVar9) {
        iVar1 = *(int *)(lVar5 + uVar11 * 8);
        uVar15 = 1;
        do {
          uVar14 = (uint)uVar15;
          iVar2 = *(int *)(lVar5 + uVar17 * 8);
          if ((iVar1 < iVar2) ||
             ((iVar1 <= iVar2 &&
              (*(int *)(lVar5 + 4 + uVar11 * 8) < *(int *)(lVar5 + 4 + uVar17 * 8))))) break;
          uVar14 = uVar14 + 1;
          uVar15 = (ulong)uVar14;
          uVar17 = uVar11 + uVar15;
        } while (uVar17 < uVar9);
      }
      pVar18 = std::
               __equal_range<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::pair<int,int>,__gnu_cxx::__ops::_Iter_comp_val<std::less<std::pair<int,int>>>,__gnu_cxx::__ops::_Val_comp_iter<std::less<std::pair<int,int>>>>
                         (_Var16._M_current,local_58,lVar5 + uVar11 * 8);
      this = (impl *)pVar18.second._M_current;
      puVar7 = (local_60->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
               .super__Vector_impl_data._M_start;
      uVar6 = ((long)pVar18.first._M_current._M_current - (long)_Var16._M_current >> 3) +
              puVar7[uVar11];
      puVar7[uVar11] = uVar6;
      uVar9 = (long)this - (long)pVar18.first._M_current >> 3;
      if (uVar14 != 0) {
        uVar15 = (uVar6 + uVar9) / (ulong)(uVar14 + 1) + 1;
        uVar10 = (ulong)uVar14;
        do {
          uVar3 = puVar7[uVar11];
          uVar12 = uVar4 + ((uVar11 & 0xffffffff) < uVar8);
          uVar13 = uVar12 - uVar3;
          if (uVar12 < uVar3 || uVar13 == 0) {
            uVar13 = 0;
          }
          else {
            if (uVar13 <= uVar15) {
              uVar13 = uVar15;
            }
            if (uVar9 < uVar13) {
              uVar13 = uVar9;
            }
            uVar9 = uVar9 - uVar13;
          }
          puVar7[uVar11] = uVar13 + uVar3;
          uVar11 = uVar11 + 1;
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
      }
      puVar7[uVar17] = puVar7[uVar17] + uVar9;
      lVar5 = *local_48;
      uVar9 = local_48[1] - lVar5 >> 3;
      uVar11 = uVar17;
      _Var16._M_current = (pair<int,_int> *)this;
    } while (uVar17 < uVar9);
  }
  puVar7 = (local_60->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar7[(long)*(int *)(local_38 + 0x10) + -1] =
       puVar7[(long)*(int *)(local_38 + 0x10) + -1] + (local_58 - (long)this >> 3);
  uVar4 = 0;
  for (; puVar7 != (local_60->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish; puVar7 = puVar7 + 1) {
    uVar4 = uVar4 + *puVar7;
  }
  if (uVar4 != local_40) {
    MPI_Comm_rank(&ompi_mpi_comm_world,&local_50);
    printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",local_50 & 0xffffffff,
           "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/samplesort.hpp"
           ,0xec,"split",
           "std::accumulate(send_counts.begin(), send_counts.end(), static_cast<size_t>(0)) == local_size"
          );
    fflush(_stdout);
    MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
  }
  return local_60;
}

Assistant:

std::vector<size_t> split(_Iterator begin, _Iterator end, _Compare comp, const std::vector<typename std::iterator_traits<_Iterator>::value_type>& splitters, const mxx::comm& comm) {
    // 5. locally find splitter positions in data
    //    (if an identical splitter appears at least three times (or more),
    //    then split the intermediary buckets evenly) => send_counts
    MXX_ASSERT(splitters.size() == (size_t)comm.size() - 1);
    std::vector<size_t> send_counts(comm.size(), 0);
    _Iterator pos = begin;
    size_t local_size = std::distance(begin, end);
    blk_dist local_part(local_size, comm.size(), comm.rank());
    for (size_t i = 0; i < splitters.size();) {
        // get the number of splitters which are equal starting from `i`
        unsigned int split_by = 1;
        while (i+split_by < splitters.size()
               && !comp(splitters[i], splitters[i+split_by])) {
            ++split_by;
        }

        // get the range of equal elements
        std::pair<_Iterator, _Iterator> eqr = std::equal_range(pos, end, splitters[i], comp);

        // assign smaller elements to processor left of splitter (= `i`)
        send_counts[i] += std::distance(pos, eqr.first);
        pos = eqr.first;

        // split equal elements fairly across processors
        size_t eq_size = std::distance(pos, eqr.second);
        // try to split approx equal:
        size_t eq_size_split = (eq_size + send_counts[i]) / (split_by+1) + 1;
        for (unsigned int j = 0; j < split_by; ++j) {
            size_t out_size = 0;
            if (send_counts[i+j] < local_part.local_size(i+j)) {
                // try to distribute fairly
                out_size = std::min(std::max(local_part.local_size(i+j) - send_counts[i+j], eq_size_split), eq_size);
                eq_size -= out_size;
            }
            send_counts[i+j] += out_size;
        }
        // assign remaining elements to next processor
        send_counts[i+split_by] += eq_size;
        i += split_by;
        pos = eqr.second;
    }
    // send last elements to last processor
    size_t out_size = std::distance(pos, end);
    send_counts[comm.size() - 1] += out_size;
    MXX_ASSERT(std::accumulate(send_counts.begin(), send_counts.end(), static_cast<size_t>(0)) == local_size);
    return send_counts;
}